

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive *file,ON_wString *str)

{
  char *p;
  char *name;
  bool rc;
  ON_wString *pOStack_18;
  int len;
  ON_wString *str_local;
  ON_BinaryArchive *file_local;
  
  pOStack_18 = str;
  str_local = (ON_wString *)file;
  ON_wString::Empty(str);
  name._4_4_ = 0;
  name._3_1_ = ON_BinaryArchive::ReadInt
                         ((ON_BinaryArchive *)str_local,(ON__INT32 *)((long)&name + 4));
  if (((bool)name._3_1_) && (0 < name._4_4_)) {
    p = (char *)oncalloc(1,(long)(name._4_4_ + 1));
    name._3_1_ = ON_BinaryArchive::ReadString((ON_BinaryArchive *)str_local,(long)name._4_4_,p);
    if ((bool)name._3_1_) {
      ON_wString::operator=(pOStack_18,p);
    }
    if (p != (char *)0x0) {
      onfree(p);
    }
  }
  return (bool)(name._3_1_ & 1);
}

Assistant:

static bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive& file, ON_wString& str )
{
  // reads legacy 1.0 named view TCODE_NAME chunk
  str.Empty();
  int len = 0;
  bool rc = file.ReadInt( &len );
  if (rc && len > 0) {
    char* name = (char*)oncalloc( 1, len + 1);
    rc = file.ReadString( len, name );
    if (rc)
      str = name; // ASCII -> UNICODE
    if (name)
      onfree(name);
  }
  return rc;
}